

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double chi_square_cdf_inv(double cdf,double a)

{
  int iVar1;
  char *pcVar2;
  double p;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (cdf < 2e-06) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"CHI_SQUARE_CDF_INV - Fatal error!\n");
    pcVar2 = "  CDF < CDF_MIN.\n";
  }
  else {
    if (cdf <= 0.999998) {
      p = a * 0.5;
      dVar7 = p + -1.0;
      dVar3 = lgamma(p);
      dVar4 = log(cdf);
      if (dVar4 * -1.24 <= a) {
        if (a <= 0.32) {
          dVar6 = log(1.0 - cdf);
          dVar4 = 0.4;
          do {
            dVar8 = (dVar4 + 4.67) * dVar4 + 1.0;
            dVar9 = ((dVar4 + 6.66) * dVar4 + 6.73) * dVar4;
            dVar5 = exp(dVar4 * 0.5 + dVar6 + dVar3 + dVar7 * 0.6931471806);
            dVar5 = dVar4 - (1.0 - (dVar5 * dVar9) / dVar8) /
                            (((dVar4 + dVar4 + 4.67) / dVar8 + -0.5) -
                            ((dVar4 * 3.0 + 13.32) * dVar4 + 6.73) / dVar9);
            dVar8 = dVar4 / dVar5;
            dVar4 = dVar5;
          } while (0.01 < ABS(dVar8 + -1.0));
        }
        else {
          dVar4 = normal_01_cdf_inv(cdf);
          dVar6 = 0.222222 / a;
          if (dVar6 < 0.0) {
            dVar5 = sqrt(dVar6);
          }
          else {
            dVar5 = SQRT(dVar6);
          }
          dVar5 = pow((dVar4 * dVar5 + 1.0) - dVar6,3.0);
          dVar5 = dVar5 * a;
          if (a * 2.2 + 6.0 < dVar5) {
            dVar4 = log(1.0 - cdf);
            dVar6 = log(dVar5 * 0.5);
            dVar5 = ((dVar4 - dVar6 * dVar7) + dVar3) * -2.0;
          }
        }
      }
      else {
        dVar4 = exp(p * 0.6931471806 + dVar3);
        dVar5 = pow(dVar4 * p * cdf,1.0 / p);
        if (dVar5 < 5e-07) {
          return dVar5;
        }
      }
      iVar1 = 0x15;
      do {
        iVar1 = iVar1 + -1;
        if (iVar1 == 0) {
          std::operator<<((ostream *)&std::cout," \n");
          std::operator<<((ostream *)&std::cout,"CHI_SQUARE_CDF_INV - Warning!\n");
          std::operator<<((ostream *)&std::cout,"  Convergence not reached.\n");
          return dVar5;
        }
        dVar4 = r8_gamma_inc(p,dVar5 * 0.5);
        dVar6 = log(dVar5);
        dVar6 = exp(dVar6 * -dVar7 + dVar5 * 0.5 + p * 0.6931471806 + dVar3);
        dVar6 = dVar6 * (cdf - dVar4);
        dVar4 = -dVar6 / dVar5;
        dVar9 = dVar6 * 0.5 + dVar7 * dVar4;
        dVar8 = (((((dVar9 * 60.0 + 70.0) * dVar9 + 84.0) * dVar9 + 105.0) * dVar9 + 140.0) * dVar9
                + 210.0) / 420.0;
        dVar6 = ((((((dVar4 * (((dVar7 * 127.0 + 346.0) * dVar7 + 120.0) / 5040.0) +
                     ((dVar9 * 606.0 + 175.0) * dVar7 + dVar9 * 264.0 + 84.0) / 2520.0) * dVar4 +
                    (((dVar9 * 1740.0 + 889.0) * dVar9 + 294.0) * dVar7 +
                    (dVar9 * 1182.0 + 672.0) * dVar9 + 252.0) / 5040.0) * dVar4 +
                   (((dVar9 * 932.0 + 707.0) * dVar9 + 462.0) * dVar9 + 210.0) / 2520.0) * dVar4 +
                  ((((dVar9 * 1278.0 + 1141.0) * dVar9 + 966.0) * dVar9 + 735.0) * dVar9 + 420.0) /
                  2520.0) * dVar4 + dVar8) * dVar7 * dVar4 + dVar6 * 0.5 * dVar8 + 1.0) * dVar6 +
                dVar5;
        dVar4 = dVar5 / dVar6;
        dVar5 = dVar6;
      } while (ABS(dVar4 + -1.0) <= 5e-07);
      return dVar6;
    }
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"CHI_SQUARE_CDF_INV - Fatal error!\n");
    pcVar2 = "  CDF_MAX < CDF.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar2);
  exit(1);
}

Assistant:

double chi_square_cdf_inv ( double cdf, double a )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_CDF_INV inverts the Chi squared PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Best and Roberts.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Best, Roberts,
//    The Percentage Points of the Chi-Squared Distribution,
//    Algorithm AS 91,
//    Applied Statistics,
//    Volume 24, Number ?, pages 385-390, 1975.
//
//  Parameters:
//
//    Input, double CDF, a value of the chi-squared cumulative
//    probability density function.
//    0.000002 <= CDF <= 0.999998.
//
//    Input, double A, the parameter of the chi-squared
//    probability density function.  0 < A.
//
//    Output, double CHI_SQUARE_CDF_INV, the value of the chi-squared random deviate
//    with the property that the probability that a chi-squared random
//    deviate with parameter A is less than or equal to X is CDF.
//
{
  double a2;
  double aa = 0.6931471806;
  double b;
  double c;
  double c1 = 0.01;
  double c2 = 0.222222;
  double c3 = 0.32;
  double c4 = 0.4;
  double c5 = 1.24;
  double c6 = 2.2;
  double c7 = 4.67;
  double c8 = 6.66;
  double c9 = 6.73;
  double c10 = 13.32;
  double c11 = 60.0;
  double c12 = 70.0;
  double c13 = 84.0;
  double c14 = 105.0;
  double c15 = 120.0;
  double c16 = 127.0;
  double c17 = 140.0;
  double c18 = 175.0;
  double c19 = 210.0;
  double c20 = 252.0;
  double c21 = 264.0;
  double c22 = 294.0;
  double c23 = 346.0;
  double c24 = 420.0;
  double c25 = 462.0;
  double c26 = 606.0;
  double c27 = 672.0;
  double c28 = 707.0;
  double c29 = 735.0;
  double c30 = 889.0;
  double c31 = 932.0;
  double c32 = 966.0;
  double c33 = 1141.0;
  double c34 = 1182.0;
  double c35 = 1278.0;
  double c36 = 1740.0;
  double c37 = 2520.0;
  double c38 = 5040.0;
  double cdf_max = 0.999998;
  double cdf_min = 0.000002;
  double ch;
  double e = 0.0000005;
  double g;
  int i;
  int it_max = 20;
  double p1;
  double p2;
  double q;
  double s1;
  double s2;
  double s3;
  double s4;
  double s5;
  double s6;
  double t;
  double x;
  double x2;
  double xx;
//
  if ( cdf < cdf_min )
  {
    x = -1.0;
    cerr << " \n";
    cerr << "CHI_SQUARE_CDF_INV - Fatal error!\n";
    cerr << "  CDF < CDF_MIN.\n";
    exit ( 1 );
  }

  if ( cdf_max < cdf )
  {
    x = -1.0;
    cerr << " \n";
    cerr << "CHI_SQUARE_CDF_INV - Fatal error!\n";
    cerr << "  CDF_MAX < CDF.\n";
    exit ( 1 );
  }

  xx = 0.5 * a;
  c = xx - 1.0;
//
//  Compute Log ( Gamma ( A/2 ) ).
//
  g = lgamma ( a / 2.0 );
//
//  Starting approximation for small chi-squared.
//
  if ( a < -c5 * log ( cdf ) )
  {
    ch = pow ( ( cdf * xx * exp ( g + xx * aa ) ), ( 1.0 / xx ) );

    if ( ch < e )
    {
      x = ch;
      return x;
    }
  }
//
//  Starting approximation for A less than or equal to 0.32.
//
  else if ( a <= c3 )
  {
    ch = c4;
    a2 = log ( 1.0 - cdf );

    for ( ; ; )
    {
      q = ch;
      p1 = 1.0 + ch * ( c7 + ch );
      p2 = ch * ( c9 + ch * ( c8 + ch ) );

      t = - 0.5 + ( c7 + 2.0 * ch ) / p1 - ( c9 + ch * ( c10 + 3.0 * ch ) ) / p2;

      ch = ch - ( 1.0 - exp ( a2 + g + 0.5 * ch + c * aa ) * p2 / p1 ) / t;

      if ( fabs ( q / ch - 1.0 ) <= c1 )
      {
        break;
      }
    }
  }
//
//  Call to algorithm AS 111.
//  Note that P has been tested above.
//  AS 241 could be used as an alternative.
//
  else
  {
    x2 = normal_01_cdf_inv ( cdf );
//
//  Starting approximation using Wilson and Hilferty estimate.
//
    p1 = c2 / a;
    ch = a * pow ( ( x2 * sqrt ( p1 ) + 1.0 - p1 ), 3 );
//
//  Starting approximation for P tending to 1.
//
    if ( c6 * a + 6.0 < ch )
    {
      ch = - 2.0 * ( log ( 1.0 - cdf ) - c * log ( 0.5 * ch ) + g );
    }
  }
//
//  Call to algorithm AS 239 and calculation of seven term Taylor series.
//
  for ( i = 1; i <= it_max; i++ )
  {
    q = ch;
    p1 = 0.5 * ch;
    p2 = cdf - r8_gamma_inc ( xx, p1 );
    t = p2 * exp ( xx * aa + g + p1 - c * log ( ch ) );
    b = t / ch;
    a2 = 0.5 * t - b * c;

    s1 = ( c19 + a2
       * ( c17 + a2
       * ( c14 + a2
       * ( c13 + a2
       * ( c12 + a2
       *   c11 ) ) ) ) ) / c24;

    s2 = ( c24 + a2
       * ( c29 + a2
       * ( c32 + a2
       * ( c33 + a2
       *   c35 ) ) ) ) / c37;

    s3 = ( c19 + a2
       * ( c25 + a2
       * ( c28 + a2
       *   c31 ) ) ) / c37;

    s4 = ( c20 + a2
       * ( c27 + a2
       *   c34 ) + c
       * ( c22 + a2
       * ( c30 + a2
       *   c36 ) ) ) / c38;

    s5 = ( c13 + c21 * a2 + c * ( c18 + c26 * a2 ) ) / c37;

    s6 = ( c15 + c * ( c23 + c16 * c ) ) / c38;

    ch = ch + t * ( 1.0 + 0.5 * t * s1 - b * c
      * ( s1 - b
      * ( s2 - b
      * ( s3 - b
      * ( s4 - b
      * ( s5 - b
      *   s6 ) ) ) ) ) );

    if ( e < fabs ( q / ch - 1.0 ) )
    {
      x = ch;
      return x;
    }

  }

  x = ch;
  cout << " \n";
  cout << "CHI_SQUARE_CDF_INV - Warning!\n";
  cout << "  Convergence not reached.\n";

  return x;
}